

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::updateScrollBars(QMdiAreaPrivate *this)

{
  QWidget *this_00;
  Representation RVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  int iVar7;
  QSize QVar8;
  int extraout_var;
  QStyle *pQVar9;
  int iVar10;
  int step;
  Representation RVar11;
  uint uVar12;
  Representation RVar13;
  bool bVar14;
  QRect QVar15;
  int local_50;
  
  if ((this->ignoreGeometryChange == false) &&
     (((this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff ||
      ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff)))) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    QVar8 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_00);
    local_50 = (int)QVar8.ht.m_i;
    (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider).
                           super_QWidget + 0x70))();
    iVar4 = (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).vbar)->
                                   super_QAbstractSlider).super_QWidget + 0x70))();
    pQVar9 = QWidget::style(this_00);
    iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x11,0,this_00,0);
    iVar10 = extraout_var;
    if (iVar5 != 0) {
      iVar5 = (int)(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth;
      iVar10 = 0;
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
        iVar10 = iVar5 * 2;
      }
      local_50 = local_50 - iVar10;
      iVar10 = 0;
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
        iVar10 = iVar5 * 2;
      }
      QVar8.wd.m_i = QVar8.wd.m_i.m_i - iVar10;
      QVar8.ht.m_i = 0;
      iVar10 = extraout_var + iVar5 * 2;
      iVar4 = iVar4 + iVar5 * 2;
    }
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->active);
    if ((bVar3) && (bVar3 = QWidget::isMaximized((QWidget *)(this->active).wp.value), bVar3)) {
      QVar15 = *(QRect *)(*(long *)((this->active).wp.value + 0x20) + 0x14);
    }
    else {
      QVar15 = QWidget::childrenRect((this->super_QAbstractScrollAreaPrivate).viewport);
    }
    RVar11 = QVar15.x2.m_i;
    RVar6 = QVar15.x1.m_i;
    step = (RVar11.m_i - RVar6.m_i) + 1;
    RVar13 = QVar8.wd.m_i;
    bVar3 = (RVar13.m_i <= RVar11.m_i || RVar6.m_i < 0) || RVar13.m_i < step;
    RVar1 = QVar15.y2.m_i;
    iVar5 = (RVar1.m_i + 1) - QVar15.y1.m_i;
    bVar14 = QVar15._0_8_ < 0;
    bVar2 = (local_50 <= RVar1.m_i || bVar14) || local_50 < iVar5;
    if (((local_50 > RVar1.m_i && !bVar14) && local_50 >= iVar5) &&
       ((RVar13.m_i <= RVar11.m_i || RVar6.m_i < 0) || RVar13.m_i < step)) {
      bVar2 = local_50 - iVar10 <= RVar1.m_i || local_50 - iVar10 < iVar5;
    }
    if (!(bool)(bVar2 ^ 1U | bVar3)) {
      bVar3 = RVar13.m_i - iVar4 <= RVar11.m_i || RVar13.m_i - iVar4 < step;
    }
    if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      iVar10 = 0;
    }
    if (!bVar3) {
      iVar10 = 0;
    }
    if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
      iVar4 = 0;
    }
    if (!bVar2) {
      iVar4 = 0;
    }
    bVar3 = QWidget::isLeftToRight(this_00);
    RVar11.m_i = ~RVar11.m_i + (RVar13.m_i - iVar4);
    if (bVar3) {
      RVar11.m_i = RVar6.m_i;
    }
    if ((this->isSubWindowsTiled == true) &&
       (iVar7 = QAbstractSlider::value
                          (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider),
       iVar7 != 0)) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
    }
    iVar7 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    uVar12 = RVar11.m_i + iVar7;
    iVar7 = (step - (RVar13.m_i - iVar4)) + uVar12;
    iVar4 = 0;
    if (0 < iVar7) {
      iVar4 = iVar7;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
               (int)uVar12 >> 0x1f & uVar12,iVar4);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step / 0x14);
    if ((this->isSubWindowsTiled == true) &&
       (iVar4 = QAbstractSlider::value
                          (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider),
       iVar4 != 0)) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
    }
    iVar4 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    uVar12 = QVar15.y1.m_i.m_i + iVar4;
    iVar10 = ((RVar1.m_i + 1) - local_50) + iVar4 + iVar10;
    iVar4 = 0;
    if (0 < iVar10) {
      iVar4 = iVar10;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,
               (int)uVar12 >> 0x1f & uVar12,iVar4);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar5);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar5 / 0x14)
    ;
    return;
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateScrollBars()
{
    if (ignoreGeometryChange || !scrollBarsEnabled())
        return;

    Q_Q(QMdiArea);
    QSize maxSize = q->maximumViewportSize();
    QSize hbarExtent = hbar->sizeHint();
    QSize vbarExtent = vbar->sizeHint();

    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        const int doubleFrameWidth = frameWidth * 2;
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rheight() -= doubleFrameWidth;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rwidth() -= doubleFrameWidth;
        hbarExtent.rheight() += doubleFrameWidth;
        vbarExtent.rwidth() += doubleFrameWidth;
    }

    const QRect childrenRect = active && active->isMaximized()
                               ? active->geometry() : viewport->childrenRect();
    bool useHorizontalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Horizontal);
    bool useVerticalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Vertical);

    if (useHorizontalScrollBar && !useVerticalScrollBar) {
        const QSize max = maxSize - QSize(0, hbarExtent.height());
        useVerticalScrollBar = useScrollBar(childrenRect, max, Qt::Vertical);
    }

    if (useVerticalScrollBar && !useHorizontalScrollBar) {
        const QSize max = maxSize - QSize(vbarExtent.width(), 0);
        useHorizontalScrollBar = useScrollBar(childrenRect, max, Qt::Horizontal);
    }

    if (useHorizontalScrollBar && hbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rheight() -= hbarExtent.height();
    if (useVerticalScrollBar && vbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rwidth() -= vbarExtent.width();

    QRect viewportRect(QPoint(0, 0), maxSize);
    const int startX = q->isLeftToRight() ? childrenRect.left() : viewportRect.right()
                                                                  - childrenRect.right();

    // Horizontal scroll bar.
    if (isSubWindowsTiled && hbar->value() != 0)
        hbar->setValue(0);
    const int xOffset = startX + hbar->value();
    hbar->setRange(qMin(0, xOffset),
                   qMax(0, xOffset + childrenRect.width() - viewportRect.width()));
    hbar->setPageStep(childrenRect.width());
    hbar->setSingleStep(childrenRect.width() / 20);

    // Vertical scroll bar.
    if (isSubWindowsTiled && vbar->value() != 0)
        vbar->setValue(0);
    const int yOffset = childrenRect.top() + vbar->value();
    vbar->setRange(qMin(0, yOffset),
                   qMax(0, yOffset + childrenRect.height() - viewportRect.height()));
    vbar->setPageStep(childrenRect.height());
    vbar->setSingleStep(childrenRect.height() / 20);
}